

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O1

void __thiscall VarTable::print(VarTable *this)

{
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  Symbol *pSVar4;
  char *pcVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n**********************************************************",
             0x3b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"VARS",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"**********************************************************",0x3a
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Lexeme",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Scope",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Scope Lexeme",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Type",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"**********************************************************",0x3a
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  lVar3 = 0;
  do {
    for (pSVar4 = (this->super_SymbolTable).block[lVar3]; pSVar4 != (Symbol *)0x0;
        pSVar4 = pSVar4->nextSymbol) {
      pcVar5 = (this->super_SymbolTable).lexemeArray;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1280c0);
      }
      else {
        pcVar5 = pcVar5 + pSVar4->lexemeIndex;
        sVar1 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pSVar4->scope);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t\t",2);
      pcVar5 = pSVar4->lexemeScope;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar1 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t\t",2);
      pcVar5 = token_id_to_name(*(int *)(pSVar4[1]._vptr_Symbol[2] + 0x38));
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar1 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar1);
      }
      if (*(int *)(pSVar4[1]._vptr_Symbol[2] + 0x38) == 10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        pcVar5 = *(char **)(pSVar4[1]._vptr_Symbol[2] + 0x30);
        if (pcVar5 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1280c0);
        }
        else {
          sVar1 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar1);
        }
      }
      if ((char)pSVar4[1].lexemeIndex == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," POINTER",8);
      }
      if (-1 < *(int *)&pSVar4[1].field_0xc) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ARRAY",6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
      std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)&pSVar4[1].lexemeScope + 4));
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x65);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"**********************************************************",0x3a
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "####################################################################################################################"
             ,0x74);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void VarTable::print() {
    cout << "\n**********************************************************" << endl;
    cout << "\t\t" << "VARS" << endl;
    cout << "**********************************************************" << endl;
    cout << "Lexeme" << "\t" << "Scope" << "\t" << "Scope Lexeme" << "\t" << "Type" <<  "\t" << "Size" << endl;
    cout << "**********************************************************" << endl;
    for (int i = 0; i < TABLE_SIZE; i++) {
        for (VarSymbol *symbol = (VarSymbol *) block[i];
             symbol != NULL; symbol = (VarSymbol *) symbol->getNextSymbol()) {
            cout << lexemeArray + symbol->getLexemeIndex() << "\t\t" << symbol->getScope() << "\t\t"
                 << symbol->getLexemeScope() << "\t\t"
                 << token_id_to_name(symbol->getType()->getType()/*symbol->getType()->getId()->getToken()*/);

            if (symbol->getType()->getType() == ID)
                cout << " " << symbol->getType()->getTypeLexeme();

            if (symbol->isPointer())
                cout << " POINTER";

            if (symbol->getArraySize() >= 0)
                cout << " ARRAY";

            cout << "\t\t" << symbol->getSize();
            cout << endl;
        }
    }
    cout << "**********************************************************" << endl;
    cout
            << "####################################################################################################################"
            << endl;
}